

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocketclient.cpp
# Opt level: O3

void __thiscall session::LoopWrite(session *this)

{
  string WSmessage;
  run_write_some_op local_79;
  element_type *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  mutable_buffers_1 local_40;
  bind_front_wrapper<void_(session::*)(boost::system::error_code,_unsigned_long),_std::shared_ptr<session>_>
  local_30;
  
  if ((accepting) ||
     (requests_abi_cxx11_.c.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      requests_abi_cxx11_.c.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur)) {
    local_58 = (undefined1 *)0x0;
    local_50 = 0;
    local_60 = &local_50;
    std::__cxx11::string::_M_assign((string *)&local_60);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front(&requests_abi_cxx11_.c);
    writing = true;
    local_40.super_mutable_buffer.data_ = local_58;
    if (local_58 != (undefined1 *)0x0) {
      local_40.super_mutable_buffer.data_ = local_60;
    }
    local_40.super_mutable_buffer.size_ = (size_t)local_58;
    std::__shared_ptr<session,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<session,void>
              ((__shared_ptr<session,(__gnu_cxx::_Lock_policy)2> *)&local_78,
               (__weak_ptr<session,_(__gnu_cxx::_Lock_policy)2> *)this);
    local_30.h_ = (offset_in_session_to_subr)on_write;
    local_30._8_8_ = 0;
    local_30.args_.
    super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<session>_>.
    super_tuple_element_impl<0UL,_std::shared_ptr<session>_>.t.
    super___shared_ptr<session,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_78;
    local_30.args_.
    super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<session>_>.
    super_tuple_element_impl<0UL,_std::shared_ptr<session>_>.t.
    super___shared_ptr<session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Stack_70;
    local_78 = (element_type *)0x0;
    p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    boost::beast::websocket::
    stream<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>>,true>
    ::run_write_some_op::operator()(&local_79,&local_30,&(this->ws_).impl_,true,&local_40);
    if (local_30.args_.
        super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<session>_>
        .super_tuple_element_impl<0UL,_std::shared_ptr<session>_>.t.
        super___shared_ptr<session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.args_.
                 super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<session>_>
                 .super_tuple_element_impl<0UL,_std::shared_ptr<session>_>.t.
                 super___shared_ptr<session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
    }
    if (local_60 != &local_50) {
      operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
    }
  }
  return;
}

Assistant:

void
session::LoopWrite() {
    if (!accepting && requests.empty()) {
#ifdef DEBUG_PRINT
        std::clog << "Not accepting!" << std::endl;
#endif
        return;
    }

    std::string WSmessage;

    try {
        WSmessage = requests.front();
        requests.pop();
#ifdef DEBUG_PRINT
        std::clog << "> Write \"" << WSmessage << "\"" << std::endl;
#endif
    } catch (...) {
        WSmessage = "";
#ifdef DEBUG_PRINT
        std::clog << "> Write queue is empty" << std::endl;
#endif
    }

    writing = true;

    ws_.async_write(
            net::buffer(WSmessage),
            beast::bind_front_handler(
                    &session::on_write,
                    shared_from_this()));
}